

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::Pooling3DLayerParams::SerializeWithCachedSizes
          (Pooling3DLayerParams *this,CodedOutputStream *output)

{
  if (this->type_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->type_,output);
  }
  if (this->kerneldepth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(2,this->kerneldepth_,output);
  }
  if (this->kernelheight_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(3,this->kernelheight_,output);
  }
  if (this->kernelwidth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(4,this->kernelwidth_,output);
  }
  if (this->stridedepth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(5,this->stridedepth_,output);
  }
  if (this->strideheight_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(6,this->strideheight_,output);
  }
  if (this->stridewidth_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(7,this->stridewidth_,output);
  }
  if (this->custompaddingfront_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(8,this->custompaddingfront_,output);
  }
  if (this->custompaddingback_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(9,this->custompaddingback_,output);
  }
  if (this->custompaddingtop_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(10,this->custompaddingtop_,output);
  }
  if (this->custompaddingbottom_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0xb,this->custompaddingbottom_,output);
  }
  if (this->custompaddingleft_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0xc,this->custompaddingleft_,output);
  }
  if (this->custompaddingright_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt32(0xd,this->custompaddingright_,output);
  }
  if (this->countexcludepadding_ == true) {
    google::protobuf::internal::WireFormatLite::WriteBool(0xe,true,output);
  }
  if (this->paddingtype_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(0xf,this->paddingtype_,output);
    return;
  }
  return;
}

Assistant:

void Pooling3DLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Pooling3DLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.Pooling3DLayerParams.PoolingType3D type = 1;
  if (this->type() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->type(), output);
  }

  // int32 kernelDepth = 2;
  if (this->kerneldepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->kerneldepth(), output);
  }

  // int32 kernelHeight = 3;
  if (this->kernelheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->kernelheight(), output);
  }

  // int32 kernelWidth = 4;
  if (this->kernelwidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(4, this->kernelwidth(), output);
  }

  // int32 strideDepth = 5;
  if (this->stridedepth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(5, this->stridedepth(), output);
  }

  // int32 strideHeight = 6;
  if (this->strideheight() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(6, this->strideheight(), output);
  }

  // int32 strideWidth = 7;
  if (this->stridewidth() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(7, this->stridewidth(), output);
  }

  // int32 customPaddingFront = 8;
  if (this->custompaddingfront() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(8, this->custompaddingfront(), output);
  }

  // int32 customPaddingBack = 9;
  if (this->custompaddingback() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(9, this->custompaddingback(), output);
  }

  // int32 customPaddingTop = 10;
  if (this->custompaddingtop() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(10, this->custompaddingtop(), output);
  }

  // int32 customPaddingBottom = 11;
  if (this->custompaddingbottom() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(11, this->custompaddingbottom(), output);
  }

  // int32 customPaddingLeft = 12;
  if (this->custompaddingleft() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(12, this->custompaddingleft(), output);
  }

  // int32 customPaddingRight = 13;
  if (this->custompaddingright() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(13, this->custompaddingright(), output);
  }

  // bool countExcludePadding = 14;
  if (this->countexcludepadding() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(14, this->countexcludepadding(), output);
  }

  // .CoreML.Specification.Pooling3DLayerParams.Pooling3DPaddingType paddingType = 15;
  if (this->paddingtype() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      15, this->paddingtype(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Pooling3DLayerParams)
}